

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

uint32 __thiscall
gflags::anon_unknown_2::CommandLineFlagParser::ParseNewCommandLineFlags
          (CommandLineFlagParser *this,int *argc,char ***argv,bool remove_flags)

{
  ValueType VVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  ostream *poVar4;
  CommandLineFlagParser local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [39];
  allocator local_139;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  int local_98;
  CommandLineFlag *local_88;
  CommandLineFlag *flag;
  string error_message;
  char *local_60;
  char *value;
  string key;
  char *local_38;
  char *arg;
  uint32 local_28;
  int i;
  int first_nonopt;
  bool remove_flags_local;
  char ***argv_local;
  int *argc_local;
  CommandLineFlagParser *this_local;
  
  local_28 = *argc;
  FlagRegistry::Lock(this->registry_);
  arg._4_4_ = 1;
  do {
    if ((int)local_28 <= arg._4_4_) {
LAB_0011eabe:
      FlagRegistry::Unlock(this->registry_);
      if (remove_flags) {
        (*argv)[(int)(local_28 - 1)] = **argv;
        *argv = *argv + (int)(local_28 - 1);
        *argc = *argc - (local_28 - 1);
        local_28 = 1;
      }
      (anonymous_namespace)::logging_is_probably_set_up = 1;
      return local_28;
    }
    pcVar3 = (*argv)[arg._4_4_];
    if ((*pcVar3 == '-') && (pcVar3[1] != '\0')) {
      local_38 = pcVar3 + 1;
      if (*local_38 == '-') {
        local_38 = pcVar3 + 2;
      }
      if (*local_38 == '\0') {
        local_28 = arg._4_4_ + 1;
        goto LAB_0011eabe;
      }
      std::__cxx11::string::string((string *)&value);
      std::__cxx11::string::string((string *)&flag);
      local_88 = FlagRegistry::SplitArgumentLocked
                           (this->registry_,local_38,(string *)&value,&local_60,(string *)&flag);
      if (local_88 == (CommandLineFlag *)0x0) {
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->undefined_names_,(key_type *)&value);
        std::__cxx11::string::operator=((string *)pmVar2,"");
        pmVar2 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->error_flags_,(key_type *)&value);
        std::__cxx11::string::operator=((string *)pmVar2,(string *)&flag);
        local_98 = 4;
      }
      else {
        if (local_60 == (char *)0x0) {
          VVar1 = CommandLineFlag::Type(local_88);
          if (VVar1 == FV_BOOL) {
            __assert_fail("flag->Type() != FlagValue::FV_BOOL",
                          "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                          ,0x42d,
                          "uint32 gflags::(anonymous namespace)::CommandLineFlagParser::ParseNewCommandLineFlags(int *, char ***, bool)"
                         );
          }
          if ((int)local_28 <= arg._4_4_ + 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_138,"ERROR: ",&local_139);
            std::operator+(local_118,(char *)local_138);
            std::operator+(local_f8,(char *)local_118);
            std::operator+(local_d8,(char *)local_f8);
            std::operator+(local_b8,(char *)local_d8);
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->error_flags_,(key_type *)&value);
            std::__cxx11::string::operator=((string *)pmVar2,(string *)local_b8);
            std::__cxx11::string::~string((string *)local_b8);
            std::__cxx11::string::~string((string *)local_d8);
            std::__cxx11::string::~string((string *)local_f8);
            std::__cxx11::string::~string((string *)local_118);
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator((allocator<char> *)&local_139);
            pcVar3 = CommandLineFlag::help(local_88);
            if ((pcVar3 != (char *)0x0) &&
               (pcVar3 = CommandLineFlag::help(local_88), '\x01' < *pcVar3)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_180,"; flag description: ",&local_181);
              CommandLineFlag::help(local_88);
              std::operator+(local_160,(char *)local_180);
              pmVar2 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&this->error_flags_,(key_type *)&value);
              std::__cxx11::string::operator+=((string *)pmVar2,(string *)local_160);
              std::__cxx11::string::~string((string *)local_160);
              std::__cxx11::string::~string(local_180);
              std::allocator<char>::~allocator((allocator<char> *)&local_181);
            }
            pmVar2 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&this->error_flags_,(key_type *)&value);
            std::__cxx11::string::operator+=((string *)pmVar2,"\n");
            local_98 = 2;
            goto LAB_0011ea67;
          }
          arg._4_4_ = arg._4_4_ + 1;
          local_60 = (*argv)[arg._4_4_];
          if ((*local_60 == '-') && (VVar1 = CommandLineFlag::Type(local_88), VVar1 == FV_MAX_INDEX)
             ) {
            pcVar3 = CommandLineFlag::help(local_88);
            pcVar3 = strstr(pcVar3,"true");
            if (pcVar3 == (char *)0x0) {
              pcVar3 = CommandLineFlag::help(local_88);
              pcVar3 = strstr(pcVar3,"false");
              if (pcVar3 == (char *)0x0) goto LAB_0011ea31;
            }
            poVar4 = std::operator<<((ostream *)&std::cerr,"Did you really mean to set flag \'");
            pcVar3 = CommandLineFlag::name(local_88);
            poVar4 = std::operator<<(poVar4,pcVar3);
            poVar4 = std::operator<<(poVar4,"\' to the value \'");
            poVar4 = std::operator<<(poVar4,local_60);
            std::operator<<(poVar4,"\'?");
          }
        }
LAB_0011ea31:
        (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                  (local_1a8,(CommandLineFlag *)this,(char *)local_88,(FlagSettingMode)local_60);
        std::__cxx11::string::~string((string *)local_1a8);
        local_98 = 0;
      }
LAB_0011ea67:
      std::__cxx11::string::~string((string *)&flag);
      std::__cxx11::string::~string((string *)&value);
      if ((local_98 != 0) && (local_98 == 2)) goto LAB_0011eabe;
    }
    else {
      memmove(*argv + arg._4_4_,*argv + (long)arg._4_4_ + 1,(long)(*argc - (arg._4_4_ + 1)) << 3);
      (*argv)[*argc + -1] = pcVar3;
      local_28 = local_28 - 1;
      arg._4_4_ = arg._4_4_ + -1;
    }
    arg._4_4_ = arg._4_4_ + 1;
  } while( true );
}

Assistant:

uint32 CommandLineFlagParser::ParseNewCommandLineFlags(int* argc, char*** argv,
                                                       bool remove_flags) {
  int first_nonopt = *argc;        // for non-options moved to the end

  registry_->Lock();
  for (int i = 1; i < first_nonopt; i++) {
    char* arg = (*argv)[i];

    // Like getopt(), we permute non-option flags to be at the end.
    if (arg[0] != '-' || arg[1] == '\0') {	// must be a program argument: "-" is an argument, not a flag
      memmove((*argv) + i, (*argv) + i+1, (*argc - (i+1)) * sizeof((*argv)[i]));
      (*argv)[*argc-1] = arg;      // we go last
      first_nonopt--;              // we've been pushed onto the stack
      i--;                         // to undo the i++ in the loop
      continue;
    }
    arg++;                     // skip leading '-'
    if (arg[0] == '-') arg++;  // or leading '--'

    // -- alone means what it does for GNU: stop options parsing
    if (*arg == '\0') {
      first_nonopt = i+1;
      break;
    }

    // Find the flag object for this option
    string key;
    const char* value;
    string error_message;
    CommandLineFlag* flag = registry_->SplitArgumentLocked(arg, &key, &value,
                                                           &error_message);
    if (flag == NULL) {
      undefined_names_[key] = "";    // value isn't actually used
      error_flags_[key] = error_message;
      continue;
    }

    if (value == NULL) {
      // Boolean options are always assigned a value by SplitArgumentLocked()
      assert(flag->Type() != FlagValue::FV_BOOL);
      if (i+1 >= first_nonopt) {
        // This flag needs a value, but there is nothing available
        error_flags_[key] = (string(kError) + "flag '" + (*argv)[i] + "'"
                             + " is missing its argument");
        if (flag->help() && flag->help()[0] > '\001') {
          // Be useful in case we have a non-stripped description.
          error_flags_[key] += string("; flag description: ") + flag->help();
        }
        error_flags_[key] += "\n";
        break;    // we treat this as an unrecoverable error
      } else {
        value = (*argv)[++i];                   // read next arg for value

        // Heuristic to detect the case where someone treats a string arg
        // like a bool:
        // --my_string_var --foo=bar
        // We look for a flag of string type, whose value begins with a
        // dash, and where the flag-name and value are separated by a
        // space rather than an '='.
        // To avoid false positives, we also require the word "true"
        // or "false" in the help string.  Without this, a valid usage
        // "-lat -30.5" would trigger the warning.  The common cases we
        // want to solve talk about true and false as values.
        if (value[0] == '-'
            && flag->Type() == FlagValue::FV_STRING
            && (strstr(flag->help(), "true")
                || strstr(flag->help(), "false"))) {
          LOG(WARNING) << "Did you really mean to set flag '"
                       << flag->name() << "' to the value '"
                       << value << "'?";
        }
      }
    }

    // TODO(csilvers): only set a flag if we hadn't set it before here
    ProcessSingleOptionLocked(flag, value, SET_FLAGS_VALUE);
  }
  registry_->Unlock();

  if (remove_flags) {   // Fix up argc and argv by removing command line flags
    (*argv)[first_nonopt-1] = (*argv)[0];
    (*argv) += (first_nonopt-1);
    (*argc) -= (first_nonopt-1);
    first_nonopt = 1;   // because we still don't count argv[0]
  }

  logging_is_probably_set_up = true;   // because we've parsed --logdir, etc.

  return first_nonopt;
}